

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

Int64 __thiscall Json::Value::asInt64(Value *this)

{
  bool bVar1;
  runtime_error *prVar2;
  double *in_RDI;
  Value *in_stack_ffffffffffffffc8;
  double local_8;
  
  switch(*(undefined1 *)(in_RDI + 1)) {
  case 0:
    local_8 = 0.0;
    break;
  case 1:
    local_8 = *in_RDI;
    break;
  case 2:
    bVar1 = isInt64(in_stack_ffffffffffffffc8);
    if (!bVar1) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar2,"LargestUInt out of Int64 range");
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_8 = *in_RDI;
    break;
  case 3:
    bVar1 = InRange<long_long,long_long>(*in_RDI,-0x8000000000000000,0x7fffffffffffffff);
    if (!bVar1) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar2,"double out of Int64 range");
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_8 = (double)(long)*in_RDI;
    break;
  default:
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"Value is not convertible to Int64.");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case 5:
    local_8 = (double)(long)(int)(uint)(((ulong)*in_RDI & 1) != 0);
  }
  return (Int64)local_8;
}

Assistant:

Value::Int64 Value::asInt64() const {
  switch (type_) {
  case intValue:
    return Int64(value_.int_);
  case uintValue:
    JSON_ASSERT_MESSAGE(isInt64(), "LargestUInt out of Int64 range");
    return Int64(value_.uint_);
  case realValue:
    JSON_ASSERT_MESSAGE(InRange(value_.real_, minInt64, maxInt64),
                        "double out of Int64 range");
    return Int64(value_.real_);
  case nullValue:
    return 0;
  case booleanValue:
    return value_.bool_ ? 1 : 0;
  default:
    break;
  }
  JSON_FAIL_MESSAGE("Value is not convertible to Int64.");
}